

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O0

HPDF_UINT MeasureText(HPDF_Font font,HPDF_BYTE *text,HPDF_UINT len,HPDF_REAL width,
                     HPDF_REAL font_size,HPDF_REAL char_space,HPDF_REAL word_space,
                     HPDF_BOOL wordwrap,HPDF_REAL *real_width)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  HPDF_UINT16 HVar4;
  HPDF_ByteType HVar5;
  ushort local_96;
  HPDF_UINT16 local_94;
  HPDF_UINT16 cid;
  HPDF_UINT16 tmp_w;
  HPDF_UINT16 code;
  HPDF_UNICODE unicode;
  HPDF_ByteType btype;
  HPDF_BYTE b2;
  HPDF_BYTE b;
  HPDF_CIDFontDefAttr cid_fontdef_attr;
  undefined1 local_78 [4];
  HPDF_INT dw2;
  HPDF_ParseText_Rec parse_state;
  HPDF_Encoder encoder;
  HPDF_FontAttr attr;
  HPDF_UINT local_48;
  HPDF_UINT i;
  HPDF_UINT tmp_len;
  HPDF_REAL w;
  HPDF_REAL *real_width_local;
  HPDF_BOOL wordwrap_local;
  HPDF_REAL word_space_local;
  HPDF_REAL char_space_local;
  HPDF_REAL font_size_local;
  HPDF_REAL width_local;
  HPDF_UINT len_local;
  HPDF_BYTE *text_local;
  HPDF_Font font_local;
  
  i = 0;
  local_48 = 0;
  pvVar3 = font->attr;
  parse_state._16_8_ = *(undefined8 *)((long)pvVar3 + 0x20);
  if (*(int *)(*(long *)((long)pvVar3 + 0x18) + 0x98) == 2) {
    cid_fontdef_attr._4_2_ = *(short *)(*(long *)(*(long *)((long)pvVar3 + 0x18) + 0xf8) + 0xc);
  }
  else {
    cid_fontdef_attr._4_2_ =
         (short)(int)(*(float *)(*(long *)((long)pvVar3 + 0x18) + 0xc4) -
                     *(float *)(*(long *)((long)pvVar3 + 0x18) + 0xcc));
  }
  HPDF_Encoder_SetParseText
            ((HPDF_Encoder)parse_state._16_8_,(HPDF_ParseText_Rec *)local_78,text,len);
  attr._4_4_ = 0;
  _width_local = text;
  while( true ) {
    if (len <= attr._4_4_) {
      if (real_width != (HPDF_REAL *)0x0) {
        *real_width = (HPDF_REAL)i;
      }
      return len;
    }
    bVar1 = *_width_local;
    bVar2 = _width_local[1];
    HVar5 = HPDF_Encoder_ByteType((HPDF_Encoder)parse_state._16_8_,(HPDF_ParseText_Rec *)local_78);
    local_94 = (HPDF_UINT16)bVar1;
    local_96 = 0;
    if (HVar5 == HPDF_BYTE_TYPE_LEAD) {
      local_94 = local_94 * 0x100 + (ushort)bVar2;
    }
    if (wordwrap == 0) {
      if (((bVar1 == 0) || (bVar1 == 9)) ||
         ((bVar1 == 10 || (((bVar1 == 0xc || (bVar1 == 0xd)) || (bVar1 == 0x20)))))) {
        local_48 = attr._4_4_ + 1;
        if (real_width != (HPDF_REAL *)0x0) {
          *real_width = (HPDF_REAL)i;
        }
      }
      else if (((HVar5 == HPDF_BYTE_TYPE_SINGLE) || (HVar5 == HPDF_BYTE_TYPE_LEAD)) &&
              (local_48 = attr._4_4_, real_width != (HPDF_REAL *)0x0)) {
        *real_width = (HPDF_REAL)i;
      }
    }
    else if (((((bVar1 == 0) || (bVar1 == 9)) || (bVar1 == 10)) ||
             (((bVar1 == 0xc || (bVar1 == 0xd)) || (bVar1 == 0x20)))) &&
            (local_48 = attr._4_4_ + 1, real_width != (HPDF_REAL *)0x0)) {
      *real_width = (HPDF_REAL)i;
    }
    if (((bVar1 == 0) || (bVar1 == 9)) ||
       ((bVar1 == 10 || (((bVar1 == 0xc || (bVar1 == 0xd)) || (bVar1 == 0x20)))))) {
      i = (HPDF_UINT)(word_space + (float)i);
    }
    if (HVar5 != HPDF_BYTE_TYPE_TRAIL) {
      if (*(int *)((long)pvVar3 + 4) == 0) {
        if (*(int *)(*(long *)((long)pvVar3 + 0x18) + 0x98) == 2) {
          HVar4 = HPDF_CMapEncoder_ToCID((HPDF_Encoder)parse_state._16_8_,local_94);
          local_96 = HPDF_CIDFontDef_GetCIDWidth(*(HPDF_FontDef *)((long)pvVar3 + 0x18),HVar4);
        }
        else {
          HVar4 = (**(code **)(parse_state._16_8_ + 0xa8))(parse_state._16_8_,local_94);
          local_96 = HPDF_TTFontDef_GetCharWidth(*(HPDF_FontDef *)((long)pvVar3 + 0x18),HVar4);
        }
      }
      else {
        local_96 = -cid_fontdef_attr._4_2_;
      }
      if (attr._4_4_ != 0) {
        i = (HPDF_UINT)(char_space + (float)i);
      }
    }
    i = (HPDF_UINT)(((float)local_96 * font_size) / 1000.0 + (float)i);
    if ((width < (float)i) || (bVar1 == 10)) break;
    attr._4_4_ = attr._4_4_ + 1;
    _width_local = _width_local + 1;
  }
  return local_48;
}

Assistant:

static HPDF_UINT
MeasureText  (HPDF_Font          font,
              const HPDF_BYTE   *text,
              HPDF_UINT          len,
              HPDF_REAL          width,
              HPDF_REAL          font_size,
              HPDF_REAL          char_space,
              HPDF_REAL          word_space,
              HPDF_BOOL          wordwrap,
              HPDF_REAL         *real_width)
{
    HPDF_REAL w = 0;
    HPDF_UINT tmp_len = 0;
    HPDF_UINT i;
    HPDF_FontAttr attr = (HPDF_FontAttr)font->attr;
    //HPDF_ByteType last_btype = HPDF_BYTE_TYPE_TRAIL;
    HPDF_Encoder encoder = attr->encoder;
    HPDF_ParseText_Rec  parse_state;
    HPDF_INT dw2;

    HPDF_PTRACE ((" HPDF_Type0Font_MeasureText\n"));

    if (attr->fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        HPDF_CIDFontDefAttr cid_fontdef_attr =
                (HPDF_CIDFontDefAttr)attr->fontdef->attr;
        dw2 = cid_fontdef_attr->DW2[1];
    } else {
        dw2 = (HPDF_INT)(attr->fontdef->font_bbox.bottom -
                    attr->fontdef->font_bbox.top);
    }

    HPDF_Encoder_SetParseText (encoder, &parse_state, text, len);

    for (i = 0; i < len; i++) {
        HPDF_BYTE b = *text++;
        HPDF_BYTE b2 = *text;  /* next byte */
        HPDF_ByteType btype = HPDF_Encoder_ByteType (encoder, &parse_state);
        HPDF_UNICODE unicode;
        HPDF_UINT16 code = b;
        HPDF_UINT16 tmp_w = 0;

        if (btype == HPDF_BYTE_TYPE_LEAD) {
            code <<= 8;
            code = (HPDF_UINT16)(code + b2);
        }

        if (!wordwrap) {
            if (HPDF_IS_WHITE_SPACE(b)) {
                tmp_len = i + 1;
                if (real_width)
                    *real_width = w;
            } else if (btype == HPDF_BYTE_TYPE_SINGLE ||
                        btype == HPDF_BYTE_TYPE_LEAD) {
                tmp_len = i;
                if (real_width)
                    *real_width = w;
            }
        } else {
            if (HPDF_IS_WHITE_SPACE(b)) {
                tmp_len = i + 1;
                if (real_width)
                    *real_width = w;
            } /* else
			//Commenting this out fixes problem with HPDF_Text_Rect() splitting the words
            if (last_btype == HPDF_BYTE_TYPE_TRAIL ||
                    (btype == HPDF_BYTE_TYPE_LEAD &&
                    last_btype == HPDF_BYTE_TYPE_SINGLE)) {
                if (!HPDF_Encoder_CheckJWWLineHead(encoder, code)) {
                    tmp_len = i;
                    if (real_width)
                        *real_width = w;
                }
            }*/
        }

        if (HPDF_IS_WHITE_SPACE(b)) {
            w += word_space;
        }

        if (btype != HPDF_BYTE_TYPE_TRAIL) {
            if (attr->writing_mode == HPDF_WMODE_HORIZONTAL) {
                if (attr->fontdef->type == HPDF_FONTDEF_TYPE_CID) {
                    /* cid-based font */
                    HPDF_UINT16 cid = HPDF_CMapEncoder_ToCID (encoder, code);
                    tmp_w = HPDF_CIDFontDef_GetCIDWidth (attr->fontdef, cid);
                } else {
                    /* unicode-based font */
                    unicode = (encoder->to_unicode_fn)(encoder, code);
                    tmp_w = HPDF_TTFontDef_GetCharWidth (attr->fontdef,
                            unicode);
                }
            } else {
                tmp_w = (HPDF_UINT16)(-dw2);
            }

            if (i > 0)
                w += char_space;
        }

        w += (HPDF_REAL)((HPDF_DOUBLE)tmp_w * font_size / 1000);

        /* 2006.08.04 break when it encountered  line feed */
        if (w > width || b == 0x0A)
            return tmp_len;

        /*
        if (HPDF_IS_WHITE_SPACE(b))
            last_btype = HPDF_BYTE_TYPE_TRAIL;
        else
            last_btype = btype;
        */

    }

    /* all of text can be put in the specified width */
    if (real_width)
        *real_width = w;

    return len;
}